

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::FastInt32ToBuffer(int32 i,char *buffer)

{
  char *pcVar1;
  char *p;
  char *buffer_local;
  int32 i_local;
  char *local_8;
  
  pcVar1 = buffer + 10;
  buffer[0xb] = '\0';
  i_local = i;
  if (i < 0) {
    if (i < -9) {
      *pcVar1 = (char)(-(i + 10) % 10) + '0';
      i_local = -(i + 10) / 10 + 1;
      p = buffer + 9;
      do {
        local_8 = p + -1;
        *p = (char)(i_local % 10) + '0';
        i_local = i_local / 10;
        p = local_8;
      } while (0 < i_local);
      *local_8 = '-';
    }
    else {
      local_8 = buffer + 9;
      *pcVar1 = '0' - (char)i;
      *local_8 = '-';
    }
  }
  else {
    do {
      p = pcVar1;
      *p = (char)(i_local % 10) + '0';
      i_local = i_local / 10;
      pcVar1 = p + -1;
    } while (0 < i_local);
    local_8 = p;
  }
  return local_8;
}

Assistant:

char *FastInt32ToBuffer(int32 i, char* buffer) {
  // We could collapse the positive and negative sections, but that
  // would be slightly slower for positive numbers...
  // 12 bytes is enough to store -2**32, -4294967296.
  char* p = buffer + kFastInt32ToBufferOffset;
  *p-- = '\0';
  if (i >= 0) {
    do {
      *p-- = '0' + i % 10;
      i /= 10;
    } while (i > 0);
    return p + 1;
  } else {
    // On different platforms, % and / have different behaviors for
    // negative numbers, so we need to jump through hoops to make sure
    // we don't divide negative numbers.
    if (i > -10) {
      i = -i;
      *p-- = '0' + i;
      *p = '-';
      return p;
    } else {
      // Make sure we aren't at MIN_INT, in which case we can't say i = -i
      i = i + 10;
      i = -i;
      *p-- = '0' + i % 10;
      // Undo what we did a moment ago
      i = i / 10 + 1;
      do {
        *p-- = '0' + i % 10;
        i /= 10;
      } while (i > 0);
      *p = '-';
      return p;
    }
  }
}